

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::memorySemanticsCheck
          (TParseContext *this,TSourceLoc *loc,TFunction *fnCandidate,TIntermOperator *callNode)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  uint uVar2;
  TOperator TVar3;
  undefined4 extraout_var;
  long lVar4;
  long *plVar5;
  long lVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  uint local_44;
  
  iVar1 = (*(callNode->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x12])(callNode);
  lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x198))
                    ((long *)CONCAT44(extraout_var,iVar1));
  plVar5 = (long *)(**(code **)(*(long *)**(undefined8 **)(lVar4 + 8) + 0x18))();
  iVar1 = (**(code **)(*plVar5 + 0x100))(plVar5);
  uVar8 = 0;
  uVar7 = 0;
  if (iVar1 == 0xe) {
    plVar5 = (long *)(**(code **)(*plVar5 + 0xf0))(plVar5);
    lVar6 = (**(code **)(*plVar5 + 0x40))(plVar5);
    uVar7 = (ulong)((*(byte *)(lVar6 + 2) & 4) >> 2);
  }
  TVar3 = callNode->op;
  switch(TVar3) {
  case EOpAtomicAdd:
  case EOpAtomicSubtract:
  case EOpAtomicMin:
  case EOpAtomicMax:
  case EOpAtomicAnd:
  case EOpAtomicOr:
  case EOpAtomicXor:
  case EOpAtomicExchange:
  case EOpAtomicStore:
    lVar6 = (**(code **)(**(long **)(*(long *)(lVar4 + 8) + 0x18) + 0x28))();
    local_44 = **(uint **)(*(long *)(lVar6 + 0xc0) + 8);
    plVar5 = *(long **)(*(long *)(lVar4 + 8) + 0x20);
    break;
  case EOpAtomicCompSwap:
    lVar6 = (**(code **)(**(long **)(*(long *)(lVar4 + 8) + 0x20) + 0x28))();
    local_44 = **(uint **)(*(long *)(lVar6 + 0xc0) + 8);
    lVar6 = (**(code **)(**(long **)(*(long *)(lVar4 + 8) + 0x28) + 0x28))();
    uVar8 = **(uint **)(*(long *)(lVar6 + 0xc0) + 8);
    lVar6 = (**(code **)(**(long **)(*(long *)(lVar4 + 8) + 0x30) + 0x28))();
    uVar2 = **(uint **)(*(long *)(lVar6 + 0xc0) + 8);
    plVar5 = *(long **)(*(long *)(lVar4 + 8) + 0x38);
LAB_00416c83:
    lVar4 = (**(code **)(*plVar5 + 0x28))();
    uVar10 = **(uint **)(*(long *)(lVar4 + 0xc0) + 8);
    goto LAB_004166f7;
  case EOpAtomicLoad:
switchD_004166b6_caseD_136:
    lVar6 = (**(code **)(**(long **)(*(long *)(lVar4 + 8) + 0x10) + 0x28))();
    local_44 = **(uint **)(*(long *)(lVar6 + 0xc0) + 8);
    plVar5 = *(long **)(*(long *)(lVar4 + 8) + 0x18);
    break;
  default:
    switch(TVar3) {
    case EOpImageAtomicAdd:
    case EOpImageAtomicMin:
    case EOpImageAtomicMax:
    case EOpImageAtomicAnd:
    case EOpImageAtomicOr:
    case EOpImageAtomicXor:
    case EOpImageAtomicExchange:
    case EOpImageAtomicStore:
      lVar6 = (**(code **)(**(long **)(*(long *)(lVar4 + 8) + 0x20 + uVar7 * 8) + 0x28))();
      local_44 = **(uint **)(*(long *)(lVar6 + 0xc0) + 8);
      plVar5 = *(long **)((ulong)(uint)((int)uVar7 << 3) + 0x28 + *(long *)(lVar4 + 8));
      break;
    case EOpImageAtomicCompSwap:
      uVar9 = (ulong)(uint)((int)uVar7 * 8);
      lVar6 = (**(code **)(**(long **)(uVar9 + 0x28 + *(long *)(lVar4 + 8)) + 0x28))();
      local_44 = **(uint **)(*(long *)(lVar6 + 0xc0) + 8);
      lVar6 = (**(code **)(**(long **)(*(long *)(lVar4 + 8) + 0x30 + uVar7 * 8) + 0x28))();
      uVar8 = **(uint **)(*(long *)(lVar6 + 0xc0) + 8);
      lVar6 = (**(code **)(**(long **)(uVar9 + 0x38 + *(long *)(lVar4 + 8)) + 0x28))();
      uVar2 = **(uint **)(*(long *)(lVar6 + 0xc0) + 8);
      plVar5 = *(long **)(*(long *)(lVar4 + 8) + 0x40 + uVar7 * 8);
      goto LAB_00416c83;
    case EOpImageAtomicLoad:
      lVar6 = (**(code **)(**(long **)(*(long *)(lVar4 + 8) + 0x18 + uVar7 * 8) + 0x28))();
      local_44 = **(uint **)(*(long *)(lVar6 + 0xc0) + 8);
      plVar5 = *(long **)(*(long *)(lVar4 + 8) + 0x20 + uVar7 * 8);
      break;
    default:
      if (TVar3 == EOpBarrier) goto switchD_004166b6_caseD_136;
      local_44 = 0;
      uVar2 = 0;
      uVar10 = 0;
      if (TVar3 == EOpMemoryBarrier) {
        lVar6 = (**(code **)(**(long **)(*(long *)(lVar4 + 8) + 8) + 0x28))();
        local_44 = **(uint **)(*(long *)(lVar6 + 0xc0) + 8);
        plVar5 = *(long **)(*(long *)(lVar4 + 8) + 0x10);
        break;
      }
      goto LAB_004167e5;
    }
  }
  lVar4 = (**(code **)(*plVar5 + 0x28))();
  uVar8 = **(uint **)(*(long *)(lVar4 + 0xc0) + 8);
  uVar10 = 0;
  uVar2 = 0;
LAB_004166f7:
  if (((uVar8 & 2) != 0) &&
     ((callNode->op == EOpImageAtomicStore || (callNode->op == EOpAtomicStore)))) {
    iVar1 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])(fnCandidate);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"gl_SemanticsAcquire must not be used with (image) atomic store",
               *(undefined8 *)(CONCAT44(extraout_var_00,iVar1) + 8),"");
  }
  if (((uVar8 & 4) != 0) &&
     ((callNode->op == EOpImageAtomicLoad || (callNode->op == EOpAtomicLoad)))) {
    iVar1 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])(fnCandidate);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"gl_SemanticsRelease must not be used with (image) atomic load",
               *(undefined8 *)(CONCAT44(extraout_var_01,iVar1) + 8),"");
  }
  if (((uVar8 & 8) != 0) &&
     ((callNode->op - EOpImageAtomicLoad < 2 || (callNode->op - EOpAtomicLoad < 2)))) {
    iVar1 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])(fnCandidate);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"gl_SemanticsAcquireRelease must not be used with (image) atomic load/store"
               ,*(undefined8 *)(CONCAT44(extraout_var_02,iVar1) + 8),"");
  }
LAB_004167e5:
  if (((uVar10 | uVar8) & 0xffff1ff1) != 0) {
    iVar1 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])(fnCandidate);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"Invalid semantics value",
               *(undefined8 *)(CONCAT44(extraout_var_03,iVar1) + 8),"");
  }
  if (((uVar2 | local_44) & 0xffffe6bf) != 0) {
    iVar1 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])(fnCandidate);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"Invalid storage class semantics value",
               *(undefined8 *)(CONCAT44(extraout_var_04,iVar1) + 8),"");
  }
  uVar2 = 0xe994U >> ((byte)uVar8 & 0xe) & 3;
  if (callNode->op == EOpMemoryBarrier) {
    if (uVar2 != 1) {
      pcVar11 = 
      "Semantics must include exactly one of gl_SemanticsRelease, gl_SemanticsAcquire, or gl_SemanticsAcquireRelease"
      ;
LAB_004168d4:
      iVar1 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])(fnCandidate);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,pcVar11,*(undefined8 *)(CONCAT44(extraout_var_06,iVar1) + 8),"");
    }
  }
  else {
    if (1 < uVar2) {
      iVar1 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])(fnCandidate);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,
                 "Semantics must not include multiple of gl_SemanticsRelease, gl_SemanticsAcquire, or gl_SemanticsAcquireRelease"
                 ,*(undefined8 *)(CONCAT44(extraout_var_05,iVar1) + 8),"");
    }
    if ((uVar10 & 0xe & (uVar10 & 0xe) - 1) != 0) {
      pcVar11 = 
      "semUnequal must not include multiple of gl_SemanticsRelease, gl_SemanticsAcquire, or gl_SemanticsAcquireRelease"
      ;
      goto LAB_004168d4;
    }
  }
  TVar3 = callNode->op;
  if (TVar3 == EOpMemoryBarrier && local_44 == 0) {
    iVar1 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])(fnCandidate);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"Storage class semantics must not be zero",
               *(undefined8 *)(CONCAT44(extraout_var_07,iVar1) + 8),"");
    TVar3 = callNode->op;
  }
  if (((local_44 == 0) && (uVar8 != 0)) && (TVar3 == EOpBarrier)) {
    iVar1 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])(fnCandidate);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"Storage class semantics must not be zero",
               *(undefined8 *)(CONCAT44(extraout_var_08,iVar1) + 8),"");
    TVar3 = callNode->op;
  }
  if (TVar3 == EOpAtomicCompSwap) {
    if ((uVar10 & 0xc) == 0) goto LAB_004169dd;
  }
  else if (((uVar10 & 0xc) == 0) || (TVar3 != EOpImageAtomicCompSwap)) goto LAB_004169dd;
  iVar1 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])(fnCandidate);
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc,"semUnequal must not be gl_SemanticsRelease or gl_SemanticsAcquireRelease",
             *(undefined8 *)(CONCAT44(extraout_var_09,iVar1) + 8),"");
LAB_004169dd:
  if ((uVar8 & 0x200c) == 0x2000) {
    iVar1 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])(fnCandidate);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "gl_SemanticsMakeAvailable requires gl_SemanticsRelease or gl_SemanticsAcquireRelease"
               ,*(undefined8 *)(CONCAT44(extraout_var_10,iVar1) + 8),"");
  }
  if ((uVar8 & 0x400a) == 0x4000) {
    iVar1 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])(fnCandidate);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "gl_SemanticsMakeVisible requires gl_SemanticsAcquire or gl_SemanticsAcquireRelease",
               *(undefined8 *)(CONCAT44(extraout_var_11,iVar1) + 8),"");
  }
  TVar3 = callNode->op;
  if (TVar3 - EOpBarrier < 2 && (short)(ushort)uVar8 < 0) {
    iVar1 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])(fnCandidate);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"gl_SemanticsVolatile must not be used with memoryBarrier or controlBarrier"
               ,*(undefined8 *)(CONCAT44(extraout_var_12,iVar1) + 8),"");
    TVar3 = callNode->op;
  }
  if (((TVar3 == EOpImageAtomicCompSwap) || (TVar3 == EOpAtomicCompSwap)) &&
     ((short)((ushort)uVar10 ^ (ushort)uVar8) < 0)) {
    iVar1 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])(fnCandidate);
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    (*UNRECOVERED_JUMPTABLE)
              (this,loc,
               "semEqual and semUnequal must either both include gl_SemanticsVolatile or neither",
               *(undefined8 *)(CONCAT44(extraout_var_13,iVar1) + 8),"",UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

void TParseContext::memorySemanticsCheck(const TSourceLoc& loc, const TFunction& fnCandidate, const TIntermOperator& callNode)
{
    const TIntermSequence* argp = &callNode.getAsAggregate()->getSequence();

    //const int gl_SemanticsRelaxed         = 0x0;
    const int gl_SemanticsAcquire         = 0x2;
    const int gl_SemanticsRelease         = 0x4;
    const int gl_SemanticsAcquireRelease  = 0x8;
    const int gl_SemanticsMakeAvailable   = 0x2000;
    const int gl_SemanticsMakeVisible     = 0x4000;
    const int gl_SemanticsVolatile        = 0x8000;

    //const int gl_StorageSemanticsNone     = 0x0;
    const int gl_StorageSemanticsBuffer   = 0x40;
    const int gl_StorageSemanticsShared   = 0x100;
    const int gl_StorageSemanticsImage    = 0x800;
    const int gl_StorageSemanticsOutput   = 0x1000;


    unsigned int semantics = 0, storageClassSemantics = 0;
    unsigned int semantics2 = 0, storageClassSemantics2 = 0;

    const TIntermTyped* arg0 = (*argp)[0]->getAsTyped();
    const bool isMS = arg0->getBasicType() == EbtSampler && arg0->getType().getSampler().isMultiSample();

    // Grab the semantics and storage class semantics from the operands, based on opcode
    switch (callNode.getOp()) {
    case EOpAtomicAdd:
    case EOpAtomicSubtract:
    case EOpAtomicMin:
    case EOpAtomicMax:
    case EOpAtomicAnd:
    case EOpAtomicOr:
    case EOpAtomicXor:
    case EOpAtomicExchange:
    case EOpAtomicStore:
        storageClassSemantics = (*argp)[3]->getAsConstantUnion()->getConstArray()[0].getIConst();
        semantics = (*argp)[4]->getAsConstantUnion()->getConstArray()[0].getIConst();
        break;
    case EOpAtomicLoad:
        storageClassSemantics = (*argp)[2]->getAsConstantUnion()->getConstArray()[0].getIConst();
        semantics = (*argp)[3]->getAsConstantUnion()->getConstArray()[0].getIConst();
        break;
    case EOpAtomicCompSwap:
        storageClassSemantics = (*argp)[4]->getAsConstantUnion()->getConstArray()[0].getIConst();
        semantics = (*argp)[5]->getAsConstantUnion()->getConstArray()[0].getIConst();
        storageClassSemantics2 = (*argp)[6]->getAsConstantUnion()->getConstArray()[0].getIConst();
        semantics2 = (*argp)[7]->getAsConstantUnion()->getConstArray()[0].getIConst();
        break;

    case EOpImageAtomicAdd:
    case EOpImageAtomicMin:
    case EOpImageAtomicMax:
    case EOpImageAtomicAnd:
    case EOpImageAtomicOr:
    case EOpImageAtomicXor:
    case EOpImageAtomicExchange:
    case EOpImageAtomicStore:
        storageClassSemantics = (*argp)[isMS ? 5 : 4]->getAsConstantUnion()->getConstArray()[0].getIConst();
        semantics = (*argp)[isMS ? 6 : 5]->getAsConstantUnion()->getConstArray()[0].getIConst();
        break;
    case EOpImageAtomicLoad:
        storageClassSemantics = (*argp)[isMS ? 4 : 3]->getAsConstantUnion()->getConstArray()[0].getIConst();
        semantics = (*argp)[isMS ? 5 : 4]->getAsConstantUnion()->getConstArray()[0].getIConst();
        break;
    case EOpImageAtomicCompSwap:
        storageClassSemantics = (*argp)[isMS ? 6 : 5]->getAsConstantUnion()->getConstArray()[0].getIConst();
        semantics = (*argp)[isMS ? 7 : 6]->getAsConstantUnion()->getConstArray()[0].getIConst();
        storageClassSemantics2 = (*argp)[isMS ? 8 : 7]->getAsConstantUnion()->getConstArray()[0].getIConst();
        semantics2 = (*argp)[isMS ? 9 : 8]->getAsConstantUnion()->getConstArray()[0].getIConst();
        break;

    case EOpBarrier:
        storageClassSemantics = (*argp)[2]->getAsConstantUnion()->getConstArray()[0].getIConst();
        semantics = (*argp)[3]->getAsConstantUnion()->getConstArray()[0].getIConst();
        break;
    case EOpMemoryBarrier:
        storageClassSemantics = (*argp)[1]->getAsConstantUnion()->getConstArray()[0].getIConst();
        semantics = (*argp)[2]->getAsConstantUnion()->getConstArray()[0].getIConst();
        break;
    default:
        break;
    }

    if ((semantics & gl_SemanticsAcquire) &&
        (callNode.getOp() == EOpAtomicStore || callNode.getOp() == EOpImageAtomicStore)) {
        error(loc, "gl_SemanticsAcquire must not be used with (image) atomic store",
              fnCandidate.getName().c_str(), "");
    }
    if ((semantics & gl_SemanticsRelease) &&
        (callNode.getOp() == EOpAtomicLoad || callNode.getOp() == EOpImageAtomicLoad)) {
        error(loc, "gl_SemanticsRelease must not be used with (image) atomic load",
              fnCandidate.getName().c_str(), "");
    }
    if ((semantics & gl_SemanticsAcquireRelease) &&
        (callNode.getOp() == EOpAtomicStore || callNode.getOp() == EOpImageAtomicStore ||
         callNode.getOp() == EOpAtomicLoad  || callNode.getOp() == EOpImageAtomicLoad)) {
        error(loc, "gl_SemanticsAcquireRelease must not be used with (image) atomic load/store",
              fnCandidate.getName().c_str(), "");
    }
    if (((semantics | semantics2) & ~(gl_SemanticsAcquire |
                                      gl_SemanticsRelease |
                                      gl_SemanticsAcquireRelease |
                                      gl_SemanticsMakeAvailable |
                                      gl_SemanticsMakeVisible |
                                      gl_SemanticsVolatile))) {
        error(loc, "Invalid semantics value", fnCandidate.getName().c_str(), "");
    }
    if (((storageClassSemantics | storageClassSemantics2) & ~(gl_StorageSemanticsBuffer |
                                                              gl_StorageSemanticsShared |
                                                              gl_StorageSemanticsImage |
                                                              gl_StorageSemanticsOutput))) {
        error(loc, "Invalid storage class semantics value", fnCandidate.getName().c_str(), "");
    }

    if (callNode.getOp() == EOpMemoryBarrier) {
        if (!IsPow2(semantics & (gl_SemanticsAcquire | gl_SemanticsRelease | gl_SemanticsAcquireRelease))) {
            error(loc, "Semantics must include exactly one of gl_SemanticsRelease, gl_SemanticsAcquire, or "
                       "gl_SemanticsAcquireRelease", fnCandidate.getName().c_str(), "");
        }
    } else {
        if (semantics & (gl_SemanticsAcquire | gl_SemanticsRelease | gl_SemanticsAcquireRelease)) {
            if (!IsPow2(semantics & (gl_SemanticsAcquire | gl_SemanticsRelease | gl_SemanticsAcquireRelease))) {
                error(loc, "Semantics must not include multiple of gl_SemanticsRelease, gl_SemanticsAcquire, or "
                           "gl_SemanticsAcquireRelease", fnCandidate.getName().c_str(), "");
            }
        }
        if (semantics2 & (gl_SemanticsAcquire | gl_SemanticsRelease | gl_SemanticsAcquireRelease)) {
            if (!IsPow2(semantics2 & (gl_SemanticsAcquire | gl_SemanticsRelease | gl_SemanticsAcquireRelease))) {
                error(loc, "semUnequal must not include multiple of gl_SemanticsRelease, gl_SemanticsAcquire, or "
                           "gl_SemanticsAcquireRelease", fnCandidate.getName().c_str(), "");
            }
        }
    }
    if (callNode.getOp() == EOpMemoryBarrier) {
        if (storageClassSemantics == 0) {
            error(loc, "Storage class semantics must not be zero", fnCandidate.getName().c_str(), "");
        }
    }
    if (callNode.getOp() == EOpBarrier && semantics != 0 && storageClassSemantics == 0) {
        error(loc, "Storage class semantics must not be zero", fnCandidate.getName().c_str(), "");
    }
    if ((callNode.getOp() == EOpAtomicCompSwap || callNode.getOp() == EOpImageAtomicCompSwap) &&
        (semantics2 & (gl_SemanticsRelease | gl_SemanticsAcquireRelease))) {
        error(loc, "semUnequal must not be gl_SemanticsRelease or gl_SemanticsAcquireRelease",
              fnCandidate.getName().c_str(), "");
    }
    if ((semantics & gl_SemanticsMakeAvailable) &&
        !(semantics & (gl_SemanticsRelease | gl_SemanticsAcquireRelease))) {
        error(loc, "gl_SemanticsMakeAvailable requires gl_SemanticsRelease or gl_SemanticsAcquireRelease",
              fnCandidate.getName().c_str(), "");
    }
    if ((semantics & gl_SemanticsMakeVisible) &&
        !(semantics & (gl_SemanticsAcquire | gl_SemanticsAcquireRelease))) {
        error(loc, "gl_SemanticsMakeVisible requires gl_SemanticsAcquire or gl_SemanticsAcquireRelease",
              fnCandidate.getName().c_str(), "");
    }
    if ((semantics & gl_SemanticsVolatile) &&
        (callNode.getOp() == EOpMemoryBarrier || callNode.getOp() == EOpBarrier)) {
        error(loc, "gl_SemanticsVolatile must not be used with memoryBarrier or controlBarrier",
              fnCandidate.getName().c_str(), "");
    }
    if ((callNode.getOp() == EOpAtomicCompSwap || callNode.getOp() == EOpImageAtomicCompSwap) &&
        ((semantics ^ semantics2) & gl_SemanticsVolatile)) {
        error(loc, "semEqual and semUnequal must either both include gl_SemanticsVolatile or neither",
              fnCandidate.getName().c_str(), "");
    }
}